

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O2

void setcharorrange(uchar **pp,uchar *charset)

{
  int iVar1;
  char_class cVar2;
  char_class cVar3;
  byte c;
  byte *pbVar4;
  byte bVar5;
  ulong uVar6;
  
  pbVar4 = *pp;
  *pp = pbVar4 + 1;
  bVar5 = *pbVar4;
  uVar6 = (ulong)bVar5;
  charset[uVar6] = '\x01';
  iVar1 = Curl_isalnum((uint)bVar5);
  if ((iVar1 != 0) && (pbVar4[1] == 0x2d)) {
    cVar2 = charclass(bVar5);
    c = pbVar4[2];
    if (c == 0x5c) {
      c = pbVar4[3];
      pbVar4 = pbVar4 + 4;
    }
    else {
      pbVar4 = pbVar4 + 3;
    }
    if (bVar5 <= c) {
      cVar3 = charclass(c);
      if (cVar3 == cVar2) {
        while( true ) {
          bVar5 = (char)uVar6 + 1;
          uVar6 = (ulong)bVar5;
          if ((byte)(bVar5 - c) == '\x01') break;
          cVar3 = charclass(bVar5);
          if (cVar3 == cVar2) {
            charset[uVar6] = '\x01';
          }
        }
        *pp = pbVar4;
      }
    }
  }
  return;
}

Assistant:

static void setcharorrange(unsigned char **pp, unsigned char *charset)
{
  unsigned char *p = (*pp)++;
  unsigned char c = *p++;

  charset[c] = 1;
  if(ISALNUM(c) && *p++ == '-') {
    char_class cc = charclass(c);
    unsigned char endrange = *p++;

    if(endrange == '\\')
      endrange = *p++;
    if(endrange >= c && charclass(endrange) == cc) {
      while(c++ != endrange)
        if(charclass(c) == cc)  /* Chars in class may be not consecutive. */
          charset[c] = 1;
      *pp = p;
    }
  }
}